

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

kStatus __thiscall
gnilk::Log::Info<char_const*,char_const*,char_const*>
          (Log *this,char *arguments,char *arguments_1,char *arguments_2)

{
  int iVar1;
  size_t sVar2;
  kStatus kVar3;
  basic_string_view<char> format;
  basic_format_args<fmt::v10::basic_printf_context<char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_2a8;
  char *local_288 [2];
  char *local_278;
  buffer<char> local_260;
  char local_240 [536];
  
  kVar3 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0xc9)) {
    sVar2 = strlen(arguments);
    local_260.size_ = 0;
    local_260._vptr_buffer = (_func_int **)&PTR_grow_001e1690;
    local_260.capacity_ = 500;
    format.size_ = sVar2;
    format.data_ = arguments;
    args.field_1.values_ = (value<fmt::v10::basic_printf_context<char>_> *)local_288;
    args.desc_ = 0xcc;
    local_288[0] = arguments_1;
    local_278 = arguments_2;
    local_260.ptr_ = local_240;
    ::fmt::v10::detail::vprintf<char,fmt::v10::basic_printf_context<char>>(&local_260,format,args);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,local_260.ptr_,local_260.ptr_ + local_260.size_);
    if (local_260.ptr_ != local_240) {
      operator_delete(local_260.ptr_,local_260.capacity_);
    }
    iVar1 = SendLogMessage(this,kInfo,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    kVar3 = (uint)(iVar1 < 1) * 2;
  }
  return kVar3;
}

Assistant:

inline kStatus Info(T... arguments) const {
            if (!(isEnabled && WithinRange(kInfo))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kInfo, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }